

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::IsLinear(ON_PolylineCurve *this,double tolerance)

{
  undefined1 uVar1;
  ON_NurbsCurve nurbs_curve;
  ON_NurbsCurve local_50;
  int iVar2;
  
  ON_NurbsCurve::ON_NurbsCurve(&local_50);
  local_50.m_dim = this->m_dim;
  local_50.m_is_rat = 0;
  local_50.m_order = 2;
  local_50.m_cv_count =
       (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (local_50.m_cv_count < 2) {
    uVar1 = 0;
  }
  else {
    local_50.m_cv = &((this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a)->x
    ;
    local_50.m_cv_stride = 3;
    local_50.m_knot = (this->m_t).m_a;
    iVar2 = (*local_50.super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                      (tolerance);
    uVar1 = (undefined1)iVar2;
    local_50.m_cv = (double *)0x0;
    local_50.m_knot = (double *)0x0;
  }
  ON_NurbsCurve::~ON_NurbsCurve(&local_50);
  return (bool)uVar1;
}

Assistant:

bool
ON_PolylineCurve::IsLinear( // true if curve locus is a line segment
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  ON_NurbsCurve nurbs_curve;
  nurbs_curve.m_dim = m_dim;
  nurbs_curve.m_is_rat = 0;
  nurbs_curve.m_order = 2;
  nurbs_curve.m_cv_count = m_pline.Count();
  if ( nurbs_curve.m_cv_count >= 2 )
  {
    nurbs_curve.m_cv = const_cast<double*>(&m_pline[0].x);
    nurbs_curve.m_cv_stride = (int)(&m_pline[1].x - nurbs_curve.m_cv); // the int converts 64 bit size_t
    nurbs_curve.m_knot = const_cast<double*>(m_t.Array());
    // using ptr to make sure we go through vtable
    const ON_Curve* ptr = &nurbs_curve;
    rc = ptr->IsLinear(tolerance);
    nurbs_curve.m_cv = 0;
    nurbs_curve.m_knot = 0;
  }
  return rc;
}